

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void DCMode(uint8_t *dst,uint8_t *left,uint8_t *top,int size,int round,int shift)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      iVar2 = 0x80;
      goto LAB_00155b2b;
    }
    uVar3 = 0;
    uVar1 = 0;
    if (0 < size) {
      uVar1 = (ulong)(uint)size;
    }
    iVar2 = 0;
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = iVar2 + (uint)left[uVar3];
    }
    iVar2 = iVar2 * 2;
  }
  else {
    uVar3 = 0;
    uVar1 = 0;
    if (0 < size) {
      uVar1 = (ulong)(uint)size;
    }
    iVar2 = 0;
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = iVar2 + (uint)top[uVar3];
    }
    if (left == (uint8_t *)0x0) {
      iVar2 = iVar2 * 2;
    }
    else {
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        iVar2 = iVar2 + (uint)left[uVar3];
      }
    }
  }
  iVar2 = iVar2 + round >> ((byte)shift & 0x1f);
LAB_00155b2b:
  Fill(dst,iVar2,size);
  return;
}

Assistant:

static WEBP_INLINE void DCMode(uint8_t* WEBP_RESTRICT dst,
                               const uint8_t* WEBP_RESTRICT left,
                               const uint8_t* WEBP_RESTRICT top,
                               int size, int round, int shift) {
  int DC = 0;
  int j;
  if (top != NULL) {
    for (j = 0; j < size; ++j) DC += top[j];
    if (left != NULL) {   // top and left present
      for (j = 0; j < size; ++j) DC += left[j];
    } else {      // top, but no left
      DC += DC;
    }
    DC = (DC + round) >> shift;
  } else if (left != NULL) {   // left but no top
    for (j = 0; j < size; ++j) DC += left[j];
    DC += DC;
    DC = (DC + round) >> shift;
  } else {   // no top, no left, nothing.
    DC = 0x80;
  }
  Fill(dst, DC, size);
}